

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O0

flat_example * flatten_example(vw *all,example *ec)

{
  bool bVar1;
  flat_example *__dest;
  size_t sVar2;
  char *pcVar3;
  char **ppcVar4;
  long in_RSI;
  full_features_and_source ffs;
  flat_example *fec;
  size_t in_stack_00000128;
  parameters *in_stack_ffffffffffffff58;
  full_features_and_source *in_stack_ffffffffffffff60;
  example *in_stack_ffffffffffffff68;
  vw *in_stack_ffffffffffffff70;
  
  __dest = calloc_or_throw<flat_example>();
  memcpy(__dest,(void *)(in_RSI + 0x6828),0x28);
  (__dest->l).simple.weight = *(float *)(in_RSI + 0x6870);
  sVar2 = v_array<char>::size((v_array<char> *)(in_RSI + 0x6878));
  __dest->tag_len = sVar2;
  if (__dest->tag_len != 0) {
    pcVar3 = calloc_or_throw<char>(in_stack_00000128);
    __dest->tag = pcVar3;
    in_stack_ffffffffffffff68 = (example *)__dest->tag;
    ppcVar4 = v_array<char>::begin((v_array<char> *)(in_RSI + 0x6878));
    memcpy(in_stack_ffffffffffffff68,*ppcVar4,__dest->tag_len);
  }
  __dest->example_counter = *(size_t *)(in_RSI + 0x6898);
  __dest->ft_offset = *(uint64_t *)(in_RSI + 0x6820);
  __dest->num_features = *(size_t *)(in_RSI + 0x68a0);
  full_features_and_source::full_features_and_source((full_features_and_source *)0x295ae1);
  parameters::stride_shift(in_stack_ffffffffffffff58);
  bVar1 = parameters::not_null(in_stack_ffffffffffffff58);
  if (bVar1) {
    in_stack_ffffffffffffff60 =
         (full_features_and_source *)parameters::mask(in_stack_ffffffffffffff58);
    parameters::stride_shift(in_stack_ffffffffffffff58);
  }
  else {
    parameters::stride_shift(in_stack_ffffffffffffff58);
  }
  GD::foreach_feature<full_features_and_source,_unsigned_long,_&vec_ffs_store>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  memcpy(&__dest->fs,&stack0xffffffffffffff70,100);
  return __dest;
}

Assistant:

flat_example* flatten_example(vw& all, example* ec)
{
  flat_example& fec = calloc_or_throw<flat_example>();
  fec.l = ec->l;
  fec.l.simple.weight = ec->weight;

  fec.tag_len = ec->tag.size();
  if (fec.tag_len > 0)
  {
    fec.tag = calloc_or_throw<char>(fec.tag_len + 1);
    memcpy(fec.tag, ec->tag.begin(), fec.tag_len);
  }

  fec.example_counter = ec->example_counter;
  fec.ft_offset = ec->ft_offset;
  fec.num_features = ec->num_features;

  full_features_and_source ffs;
  ffs.stride_shift = all.weights.stride_shift();
  if (all.weights.not_null())  // TODO:temporary fix. all.weights is not initialized at this point in some cases.
    ffs.mask = (uint64_t)all.weights.mask() >> all.weights.stride_shift();
  else
    ffs.mask = (uint64_t)LONG_MAX >> all.weights.stride_shift();
  GD::foreach_feature<full_features_and_source, uint64_t, vec_ffs_store>(all, *ec, ffs);

  fec.fs = ffs.fs;

  return &fec;
}